

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall
leveldb::TableBuilder::WriteRawBlock
          (TableBuilder *this,Slice *block_contents,CompressionType type,BlockHandle *handle)

{
  WritableFile *pWVar1;
  Rep *this_00;
  bool bVar2;
  uint32_t value;
  size_t sVar3;
  char *data;
  Slice local_68;
  Status local_58;
  uint32_t local_50;
  char local_49;
  uint32_t crc;
  char trailer [5];
  Status local_38;
  Rep *local_30;
  Rep *r;
  BlockHandle *handle_local;
  Slice *pSStack_18;
  CompressionType type_local;
  Slice *block_contents_local;
  TableBuilder *this_local;
  
  local_30 = this->rep_;
  r = (Rep *)handle;
  handle_local._4_4_ = type;
  pSStack_18 = block_contents;
  block_contents_local = (Slice *)this;
  BlockHandle::set_offset(handle,local_30->offset);
  this_00 = r;
  sVar3 = Slice::size(pSStack_18);
  BlockHandle::set_size((BlockHandle *)this_00,sVar3);
  (*local_30->file->_vptr_WritableFile[2])(&local_38,local_30->file,pSStack_18);
  Status::operator=(&local_30->status,&local_38);
  Status::~Status(&local_38);
  bVar2 = Status::ok(&local_30->status);
  if (bVar2) {
    local_49 = handle_local._4_1_;
    data = Slice::data(pSStack_18);
    sVar3 = Slice::size(pSStack_18);
    local_50 = crc32c::Value(data,sVar3);
    local_50 = crc32c::Extend(local_50,&local_49,1);
    value = crc32c::Mask(local_50);
    EncodeFixed32((char *)&crc,value);
    pWVar1 = local_30->file;
    Slice::Slice(&local_68,&local_49,5);
    (*pWVar1->_vptr_WritableFile[2])(&local_58,pWVar1,&local_68);
    Status::operator=(&local_30->status,&local_58);
    Status::~Status(&local_58);
    bVar2 = Status::ok(&local_30->status);
    if (bVar2) {
      sVar3 = Slice::size(pSStack_18);
      local_30->offset = sVar3 + 5 + local_30->offset;
    }
  }
  return;
}

Assistant:

void TableBuilder::WriteRawBlock(const Slice &block_contents,
                                     CompressionType type,
                                     BlockHandle *handle) {
        Rep *r = rep_;
        handle->set_offset(r->offset);
        handle->set_size(block_contents.size());
        r->status = r->file->Append(block_contents);
        if (r->status.ok()) {
            char trailer[kBlockTrailerSize];
            trailer[0] = type;
            uint32_t crc = crc32c::Value(block_contents.data(), block_contents.size());
            crc = crc32c::Extend(crc, trailer, 1);  // Extend crc to cover block type
            EncodeFixed32(trailer + 1, crc32c::Mask(crc));
            r->status = r->file->Append(Slice(trailer, kBlockTrailerSize));
            if (r->status.ok()) {
                r->offset += block_contents.size() + kBlockTrailerSize;
            }
        }
    }